

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall toml::type_error::type_error(type_error *this,string *what_arg)

{
  this->super_exception = (exception)&PTR__type_error_0014dd48;
  std::__cxx11::string::string((string *)&this->what_,(string *)what_arg);
  return;
}

Assistant:

explicit type_error(const std::string& what_arg) : what_(what_arg){}